

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O3

Gia_Man_t * Gia_ManBalanceLut(Gia_Man_t *p,int nLutSize,int nCutNum,int fVerbose)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *p_00;
  
  if (fVerbose == 0) {
    pGVar1 = Gia_ManDupMuxes(p,2);
    p_00 = Gia_ManBalanceInt(pGVar1,nLutSize,nCutNum,0);
  }
  else {
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
    pGVar1 = Gia_ManDupMuxes(p,2);
    Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
    p_00 = Gia_ManBalanceInt(pGVar1,nLutSize,nCutNum,fVerbose);
    Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar1);
  pGVar1 = Gia_ManDupNoMuxes(p_00);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar1,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManBalanceLut( Gia_Man_t * p, int nLutSize, int nCutNum, int fVerbose )
{
    Gia_Man_t * pNew, * pNew1, * pNew2;
    if ( fVerbose )      Gia_ManPrintStats( p, NULL );
    pNew = Gia_ManDupMuxes( p, 2 );
    if ( fVerbose )      Gia_ManPrintStats( pNew, NULL );
    pNew1 = Gia_ManBalanceInt( pNew, nLutSize, nCutNum, fVerbose );
    if ( fVerbose )      Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    pNew2 = Gia_ManDupNoMuxes( pNew1 );
    if ( fVerbose )      Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    return pNew2;
}